

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::NextRequest>::construct(BasicTypeInfo<dap::NextRequest> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::NextRequest> *this_local;
  
  memset(ptr,0,0x38);
  NextRequest::NextRequest((NextRequest *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }